

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFSPermissions.cxx
# Opt level: O3

bool cmFSPermissions::stringToModeT(string *arg,mode_t *permissions)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)arg);
  if (iVar1 == 0) {
    uVar2 = 0x100;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)arg);
    if (iVar1 == 0) {
      uVar2 = 0x80;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)arg);
      if (iVar1 == 0) {
        uVar2 = 0x40;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)arg);
        if (iVar1 == 0) {
          uVar2 = 0x20;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)arg);
          if (iVar1 == 0) {
            uVar2 = 0x10;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)arg);
            if (iVar1 == 0) {
              uVar2 = 8;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)arg);
              if (iVar1 == 0) {
                uVar2 = 4;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)arg);
                if (iVar1 == 0) {
                  uVar2 = 2;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)arg);
                  if (iVar1 == 0) {
                    uVar2 = 1;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)arg);
                    if (iVar1 == 0) {
                      uVar2 = 0x800;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)arg);
                      if (iVar1 != 0) {
                        return false;
                      }
                      uVar2 = 0x400;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *permissions = *permissions | uVar2;
  return true;
}

Assistant:

bool cmFSPermissions::stringToModeT(std::string const& arg,
                                    mode_t& permissions)
{
  if (arg == "OWNER_READ") {
    permissions |= mode_owner_read;
  } else if (arg == "OWNER_WRITE") {
    permissions |= mode_owner_write;
  } else if (arg == "OWNER_EXECUTE") {
    permissions |= mode_owner_execute;
  } else if (arg == "GROUP_READ") {
    permissions |= mode_group_read;
  } else if (arg == "GROUP_WRITE") {
    permissions |= mode_group_write;
  } else if (arg == "GROUP_EXECUTE") {
    permissions |= mode_group_execute;
  } else if (arg == "WORLD_READ") {
    permissions |= mode_world_read;
  } else if (arg == "WORLD_WRITE") {
    permissions |= mode_world_write;
  } else if (arg == "WORLD_EXECUTE") {
    permissions |= mode_world_execute;
  } else if (arg == "SETUID") {
    permissions |= mode_setuid;
  } else if (arg == "SETGID") {
    permissions |= mode_setgid;
  } else {
    return false;
  }
  return true;
}